

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O0

void __thiscall nesvis::PpuWidget::draw_nametables(PpuWidget *this)

{
  bool bVar1;
  PpuRegisters *pPVar2;
  char *label;
  string local_78;
  undefined1 local_58 [8];
  string tab_name;
  int nametable;
  int pattern_table;
  PpuRegisters reg;
  PpuWidget *this_local;
  
  reg._22_8_ = this;
  pPVar2 = n_e_s::nes::Nes::ppu_registers(this->nes_);
  reg._0_8_ = *(undefined8 *)&pPVar2->fine_x_scroll;
  reg._8_8_ = *(undefined8 *)&pPVar2->name_table_latch;
  reg._16_4_ = *(undefined4 *)&pPVar2->attribute_table_latch;
  reg.pattern_table_shifter_low = pPVar2->attribute_table_shifter_hi;
  bVar1 = n_e_s::core::Register<unsigned_char>::is_set
                    ((Register<unsigned_char> *)((long)&pattern_table + 2),4);
  tab_name.field_2._12_4_ = ZEXT14(bVar1);
  ImGui::Text("%s: %i","Pattern table used: ",(ulong)(uint)tab_name.field_2._12_4_);
  bVar1 = ImGui::BeginTabBar("MyTabBar",0);
  if (bVar1) {
    for (tab_name.field_2._8_4_ = 0; (int)tab_name.field_2._8_4_ < 4;
        tab_name.field_2._8_4_ = tab_name.field_2._8_4_ + 1) {
      std::__cxx11::to_string(&local_78,tab_name.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     "Nametable ",&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      label = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_58);
      bVar1 = ImGui::BeginTabItem(label,(bool *)0x0,0);
      if (bVar1) {
        draw_nametable(this,tab_name.field_2._8_2_);
        ImGui::EndTabItem();
      }
      std::__cxx11::string::~string((string *)local_58);
    }
    ImGui::EndTabBar();
  }
  return;
}

Assistant:

void PpuWidget::draw_nametables() {
    const auto reg = nes_->ppu_registers();
    const int pattern_table = reg.ctrl.is_set(4u) ? 1 : 0;
    ImGui::Text("%s: %i", "Pattern table used: ", pattern_table);

    if (ImGui::BeginTabBar("MyTabBar")) {
        for (auto nametable = 0; nametable < 4; ++nametable) {
            const std::string tab_name =
                    "Nametable " + std::to_string(nametable);
            if (ImGui::BeginTabItem(tab_name.c_str())) {
                draw_nametable(nametable);
                ImGui::EndTabItem();
            }
        }
        ImGui::EndTabBar();
    }
}